

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  void *pvVar5;
  void *pvVar6;
  int32_t index;
  int iVar7;
  uint uVar8;
  int iVar9;
  parasail_result_t *ppVar10;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int16_t *ptr_06;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  size_t len;
  __m128i *palVar14;
  uint uVar15;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar16;
  int iVar17;
  undefined4 in_register_00000084;
  long lVar18;
  int iVar19;
  ulong uVar20;
  undefined4 uVar23;
  undefined4 uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ulong uVar43;
  ulong uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ulong uVar57;
  ulong uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  ushort uVar63;
  ulong uVar64;
  ushort uVar72;
  ushort uVar73;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  ushort uVar74;
  ushort uVar78;
  undefined1 auVar71 [16];
  ushort uVar79;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar80 [16];
  ushort uVar87;
  short sVar88;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  undefined1 in_XMM5 [16];
  short sVar96;
  undefined1 auVar89 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar97 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar98 [16];
  short sVar99;
  ushort uVar100;
  short sVar101;
  ushort uVar102;
  short sVar103;
  ushort uVar104;
  short sVar105;
  ushort uVar106;
  short sVar107;
  ushort uVar108;
  short sVar109;
  ushort uVar110;
  short sVar111;
  ushort uVar112;
  short sVar113;
  ushort uVar114;
  int iVar115;
  int iVar119;
  int iVar120;
  undefined1 auVar116 [16];
  int iVar121;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  int iVar126;
  int iVar137;
  int iVar138;
  int iVar139;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  __m128i alVar130;
  undefined4 uVar127;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  ushort uVar144;
  ushort uVar146;
  ushort uVar147;
  ushort uVar148;
  ushort uVar149;
  ushort uVar150;
  ushort uVar151;
  int iVar152;
  undefined1 auVar145 [16];
  ushort uVar153;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  undefined1 local_208 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  ushort local_138;
  ushort uStack_136;
  ushort local_88;
  ushort uStack_86;
  short sVar21;
  short sVar22;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  undefined1 auVar131 [16];
  
  len = CONCAT44(in_register_00000084,gap);
  local_1c8._0_4_ = open;
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar3 = (profile->profile16).score;
    if (pvVar3 == (void *)0x0) {
      parasail_nw_stats_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar8 = profile->s1Len;
        if ((int)uVar8 < 1) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_stats_scan_profile_sse41_128_16_cold_1();
        }
        else {
          uVar16 = uVar8 - 1;
          uVar20 = (ulong)uVar8 + 7 >> 3;
          uVar25 = (ulong)uVar16 % uVar20;
          pvVar5 = (profile->profile16).matches;
          pvVar6 = (profile->profile16).similar;
          iVar19 = -open;
          iVar9 = ppVar4->min;
          iVar115 = -iVar9;
          if (iVar9 != iVar19 && SBORROW4(iVar9,iVar19) == iVar9 + open < 0) {
            iVar115 = open;
          }
          iVar119 = ppVar4->max;
          ppVar10 = parasail_result_new_stats();
          if (ppVar10 != (parasail_result_t *)0x0) {
            iVar17 = (int)(uVar16 / uVar20);
            ppVar10->flag = ppVar10->flag | 0x8210401;
            b = parasail_memalign___m128i(0x10,uVar20);
            b_00 = parasail_memalign___m128i(0x10,uVar20);
            b_01 = parasail_memalign___m128i(0x10,uVar20);
            b_02 = parasail_memalign___m128i(0x10,uVar20);
            ptr = parasail_memalign___m128i(0x10,uVar20);
            b_03 = parasail_memalign___m128i(0x10,uVar20);
            b_04 = parasail_memalign___m128i(0x10,uVar20);
            b_05 = parasail_memalign___m128i(0x10,uVar20);
            ptr_00 = parasail_memalign___m128i(0x10,uVar20);
            ptr_01 = parasail_memalign___m128i(0x10,uVar20);
            ptr_02 = parasail_memalign___m128i(0x10,uVar20);
            ptr_03 = parasail_memalign___m128i(0x10,uVar20);
            ptr_04 = parasail_memalign___m128i(0x10,uVar20);
            ptr_05 = parasail_memalign___m128i(0x10,uVar20);
            ptr_06 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
            auVar26._0_8_ = -(ulong)(b == (__m128i *)0x0);
            auVar26._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
            auVar27._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
            auVar27._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
            auVar26 = packssdw(auVar26,auVar27);
            auVar51._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
            auVar51._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
            auVar28._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
            auVar28._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
            auVar51 = packssdw(auVar51,auVar28);
            auVar26 = packssdw(auVar26,auVar51);
            if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                  ptr_05 != (__m128i *)0x0) &&
                 ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) && ptr_02 != (__m128i *)0x0
                 )) && ptr_06 != (int16_t *)0x0) &&
                ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                              (auVar26 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar26 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar26 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar26 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar26 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar26 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar26 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar26 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar26 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar26 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar26 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar26[0xf])) {
              iVar7 = s2Len + -1;
              auVar26 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
              uVar23 = auVar26._0_4_;
              auVar26 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
              uVar24 = auVar26._0_4_;
              uVar8 = iVar115 - 0x7fff;
              auVar51 = pshuflw(ZEXT416(uVar8),ZEXT416(uVar8),0);
              local_138 = auVar51._0_2_;
              uStack_136 = auVar51._2_2_;
              auVar26 = ZEXT416(CONCAT22((short)((uint)iVar9 >> 0x10),0x7ffe - (short)iVar119));
              auVar27 = pshuflw(auVar26,auVar26,0);
              uVar15 = (uint)uVar20;
              auVar52 = pshufb(ZEXT416(uVar15),_DAT_00906db0);
              auVar26 = pshufb(ZEXT416(-(uVar15 * gap)),_DAT_00906db0);
              auVar59 = paddsw(auVar26,ZEXT416(uVar8 & 0xffff));
              alVar130[1] = uVar20;
              alVar130[0] = uVar20;
              parasail_memset___m128i(b_03,alVar130,len);
              c[1] = extraout_RDX;
              c[0] = uVar20;
              parasail_memset___m128i(b_04,c,len);
              c_00[1] = extraout_RDX_00;
              c_00[0] = uVar20;
              parasail_memset___m128i(b_05,c_00,len);
              c_01[1] = extraout_RDX_01;
              c_01[0] = uVar20;
              parasail_memset___m128i(b,c_01,len);
              c_02[1] = extraout_RDX_02;
              c_02[0] = uVar20;
              parasail_memset___m128i(b_00,c_02,len);
              c_03[1] = extraout_RDX_03;
              c_03[0] = uVar20;
              parasail_memset___m128i(b_01,c_03,len);
              c_04[1] = extraout_RDX_04;
              c_04[0] = uVar20;
              parasail_memset___m128i(b_02,c_04,len);
              auVar97._4_4_ = uVar24;
              auVar97._0_4_ = uVar24;
              auVar97._8_4_ = uVar24;
              auVar97._12_4_ = uVar24;
              auVar60._4_4_ = uVar23;
              auVar60._0_4_ = uVar23;
              auVar60._8_4_ = uVar23;
              auVar60._12_4_ = uVar23;
              auVar60 = psubsw((undefined1  [16])0x0,auVar60);
              uVar57 = CONCAT44(0,uVar15 - 1);
              local_1a8._8_8_ = local_1a8._0_8_;
              local_1a8._0_8_ = uVar57;
              lVar11 = uVar57 << 4;
              auVar28 = pmovsxbw(extraout_XMM0,0x101010101010101);
              uVar12 = uVar20;
              auVar26 = auVar28;
              do {
                *(undefined1 (*) [16])((long)*ptr_04 + lVar11) = auVar60;
                *(undefined1 (*) [16])((long)*ptr_05 + lVar11) = auVar26;
                auVar60 = psubsw(auVar60,auVar97);
                auVar26 = paddsw(auVar26,auVar28);
                lVar11 = lVar11 + -0x10;
                iVar9 = (int)uVar12;
                uVar13 = iVar9 - 1;
                uVar12 = (ulong)uVar13;
              } while (uVar13 != 0 && 0 < iVar9);
              auVar61._4_4_ = gap;
              auVar61._0_4_ = gap;
              auVar61._8_4_ = gap;
              auVar61._12_4_ = gap;
              auVar116._8_4_ = uVar15;
              auVar116._0_8_ = uVar20;
              auVar116._12_4_ = 0;
              auVar26 = pmovsxbq(in_XMM5,0x706);
              auVar60 = pmuldq(auVar26,auVar116);
              auVar26 = pmovsxbq(in_XMM6,0x504);
              auVar97 = pmuldq(auVar26,auVar116);
              auVar26 = pmovsxbq(in_XMM7,0x302);
              auVar98 = pmuldq(auVar26,auVar116);
              auVar28 = pmuldq(auVar116,_DAT_00903a90);
              uVar12 = 0;
              auVar26 = pmovsxwd(ZEXT416(uVar15),0x8000800080008000);
              palVar14 = ptr;
              do {
                auVar122._8_4_ = (int)uVar12;
                auVar122._0_8_ = uVar12;
                auVar122._12_4_ = (int)(uVar12 >> 0x20);
                lVar11 = auVar122._8_8_;
                auVar143._0_4_ = (undefined4)(auVar97._0_8_ + uVar12);
                auVar143._4_4_ = (int)(auVar97._8_8_ + lVar11);
                auVar143._8_4_ = (int)(auVar60._0_8_ + uVar12);
                auVar143._12_4_ = (int)(auVar60._8_8_ + lVar11);
                auVar129._0_4_ = (undefined4)(uVar12 + auVar28._0_8_);
                auVar129._4_4_ = (int)(lVar11 + auVar28._8_8_);
                auVar129._8_4_ = (int)(auVar98._0_8_ + uVar12);
                auVar129._12_4_ = (int)(auVar98._8_8_ + lVar11);
                auVar122 = pmulld(auVar143,auVar61);
                auVar116 = pmulld(auVar129,auVar61);
                iVar126 = iVar19 - auVar116._0_4_;
                iVar137 = iVar19 - auVar116._4_4_;
                iVar138 = iVar19 - auVar116._8_4_;
                iVar139 = iVar19 - auVar116._12_4_;
                iVar115 = iVar19 - auVar122._0_4_;
                iVar119 = iVar19 - auVar122._4_4_;
                iVar120 = iVar19 - auVar122._8_4_;
                iVar121 = iVar19 - auVar122._12_4_;
                iVar9 = auVar26._0_4_;
                auVar134._0_4_ =
                     (uint)(iVar115 < iVar9) * iVar9 | (uint)(iVar115 >= iVar9) * iVar115;
                iVar115 = auVar26._4_4_;
                auVar134._4_4_ =
                     (uint)(iVar119 < iVar115) * iVar115 | (uint)(iVar119 >= iVar115) * iVar119;
                iVar119 = auVar26._8_4_;
                auVar134._8_4_ =
                     (uint)(iVar120 < iVar119) * iVar119 | (uint)(iVar120 >= iVar119) * iVar120;
                iVar120 = auVar26._12_4_;
                auVar134._12_4_ =
                     (uint)(iVar121 < iVar120) * iVar120 | (uint)(iVar121 >= iVar120) * iVar121;
                auVar128._0_4_ =
                     (uint)(iVar126 < iVar9) * iVar9 | (uint)(iVar126 >= iVar9) * iVar126;
                auVar128._4_4_ =
                     (uint)(iVar137 < iVar115) * iVar115 | (uint)(iVar137 >= iVar115) * iVar137;
                auVar128._8_4_ =
                     (uint)(iVar138 < iVar119) * iVar119 | (uint)(iVar138 >= iVar119) * iVar138;
                auVar128._12_4_ =
                     (uint)(iVar139 < iVar120) * iVar120 | (uint)(iVar139 >= iVar120) * iVar139;
                auVar129 = pblendw(auVar128,(undefined1  [16])0x0,0xaa);
                auVar116 = pblendw(auVar134,(undefined1  [16])0x0,0xaa);
                alVar130 = (__m128i)packusdw(auVar129,auVar116);
                *palVar14 = alVar130;
                uVar12 = uVar12 + 1;
                palVar14 = palVar14 + 1;
              } while (uVar20 != uVar12);
              *ptr_06 = 0;
              auVar60 = _DAT_00906ca0;
              lVar11 = (ulong)(uint)s2Len - 1;
              auVar65._8_4_ = (int)lVar11;
              auVar65._0_8_ = lVar11;
              auVar65._12_4_ = (int)((ulong)lVar11 >> 0x20);
              iVar121 = -gap;
              iVar126 = 0;
              auVar97 = pmovsxbq(auVar97,0x302);
              auVar98 = pmovsxbq(auVar98,0x100);
              auVar117._8_4_ = 0xffffffff;
              auVar117._0_8_ = 0xffffffffffffffff;
              auVar117._12_4_ = 0xffffffff;
              auVar116 = pmovsxbd(auVar122,0x7060504);
              uVar12 = 0;
              do {
                uVar127 = (undefined4)uVar12;
                auVar131._8_4_ = uVar127;
                auVar131._0_8_ = uVar12;
                auVar131._12_4_ = (int)(uVar12 >> 0x20);
                auVar122 = (auVar131 | auVar98) ^ auVar60;
                lVar11 = SUB168(auVar65 ^ auVar60,0);
                auVar154._0_8_ = -(ulong)(lVar11 < auVar122._0_8_);
                lVar18 = SUB168(auVar65 ^ auVar60,8);
                auVar154._8_8_ = -(ulong)(lVar18 < auVar122._8_8_);
                auVar28 = pshuflw(auVar28,auVar154,0xe8);
                auVar28 = packssdw(auVar28 ^ auVar117,auVar28 ^ auVar117);
                iVar137 = iVar19 - iVar126;
                iVar138 = iVar121 - open;
                iVar139 = iVar19 - (gap * 2 + iVar126);
                iVar152 = iVar19 - (gap * 3 + iVar126);
                if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 1] =
                       (ushort)(iVar137 < iVar9) * auVar26._0_2_ |
                       (ushort)(iVar137 >= iVar9) * (short)iVar137;
                }
                auVar122 = packssdw(auVar154,auVar154);
                auVar122 = packssdw(auVar122 ^ auVar117,auVar122 ^ auVar117);
                if ((auVar122 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 2] =
                       (ushort)(iVar138 < iVar115) * auVar26._4_2_ |
                       (ushort)(iVar138 >= iVar115) * (short)iVar138;
                }
                auVar122 = (auVar131 | auVar97) ^ auVar60;
                auVar155._0_8_ = -(ulong)(lVar11 < auVar122._0_8_);
                auVar155._8_8_ = -(ulong)(lVar18 < auVar122._8_8_);
                auVar28 = packssdw(auVar28,auVar155);
                auVar28 = packssdw(auVar28 ^ auVar117,auVar28 ^ auVar117);
                if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 3] =
                       (ushort)(iVar139 < iVar119) * auVar26._8_2_ |
                       (ushort)(iVar139 >= iVar119) * (short)iVar139;
                }
                auVar28 = pshufhw(auVar28,auVar155,0x84);
                auVar28 = packssdw(auVar28 ^ auVar117,auVar28 ^ auVar117);
                if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 4] =
                       (ushort)(iVar152 < iVar120) * auVar26._12_2_ |
                       (ushort)(iVar152 >= iVar120) * (short)iVar152;
                }
                auVar80._4_4_ = uVar127;
                auVar80._0_4_ = uVar127;
                auVar80._8_4_ = uVar127;
                auVar80._12_4_ = uVar127;
                auVar28 = pmulld(auVar80 | auVar116,auVar61);
                iVar137 = iVar19 - auVar28._0_4_;
                iVar138 = iVar19 - auVar28._4_4_;
                iVar139 = iVar19 - auVar28._8_4_;
                iVar152 = iVar19 - auVar28._12_4_;
                auVar122 = (auVar131 | _DAT_00903ad0) ^ auVar60;
                auVar145._0_8_ = -(ulong)(lVar11 < auVar122._0_8_);
                auVar145._8_8_ = -(ulong)(lVar18 < auVar122._8_8_);
                auVar28 = pshuflw(auVar28,auVar145,0xe8);
                auVar28 = packssdw(auVar28 ^ auVar117,auVar28 ^ auVar117);
                auVar156._4_4_ = uVar24;
                auVar156._0_4_ = uVar24;
                auVar156._8_4_ = uVar24;
                auVar156._12_4_ = uVar24;
                if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 5] =
                       (ushort)(iVar137 < iVar9) * auVar26._0_2_ |
                       (ushort)(iVar137 >= iVar9) * (short)iVar137;
                }
                auVar122 = packssdw(auVar145,auVar145);
                auVar28 = packssdw(auVar28,auVar122 ^ auVar117);
                if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 6] =
                       (ushort)(iVar138 < iVar115) * auVar26._4_2_ |
                       (ushort)(iVar138 >= iVar115) * (short)iVar138;
                }
                auVar122 = (auVar131 | _DAT_00903ac0) ^ auVar60;
                auVar132._0_8_ = -(ulong)(lVar11 < auVar122._0_8_);
                auVar132._8_8_ = -(ulong)(lVar18 < auVar122._8_8_);
                auVar28 = packssdw(auVar28,auVar132);
                auVar28 = packssdw(auVar28 ^ auVar117,auVar28 ^ auVar117);
                if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 7] =
                       (ushort)(iVar139 < iVar119) * auVar26._8_2_ |
                       (ushort)(iVar139 >= iVar119) * (short)iVar139;
                }
                auVar28 = pshufhw(auVar28,auVar132,0x84);
                auVar28 = packssdw(auVar28 ^ auVar117,auVar28 ^ auVar117);
                if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  ptr_06[uVar12 + 8] =
                       (ushort)(iVar152 < iVar120) * auVar26._12_2_ |
                       (ushort)(iVar152 >= iVar120) * (short)iVar152;
                }
                uVar12 = uVar12 + 8;
                iVar121 = iVar121 + gap * -8;
                iVar126 = iVar126 + gap * 8;
              } while ((s2Len + 7U & 0xfffffff8) != uVar12);
              uVar12 = 0;
              local_88 = auVar27._0_2_;
              uStack_86 = auVar27._2_2_;
              auVar118._4_4_ = uVar23;
              auVar118._0_4_ = uVar23;
              auVar118._8_4_ = uVar23;
              auVar118._12_4_ = uVar23;
              uVar79 = local_138;
              uVar81 = uStack_136;
              uVar82 = local_138;
              uVar83 = uStack_136;
              uVar84 = local_138;
              uVar85 = uStack_136;
              uVar86 = local_138;
              uVar87 = uStack_136;
              uVar144 = local_88;
              uVar146 = uStack_86;
              uVar147 = local_88;
              uVar148 = uStack_86;
              uVar149 = local_88;
              uVar150 = uStack_86;
              uVar151 = local_88;
              uVar153 = uStack_86;
              do {
                uVar43 = ptr[uVar57][0];
                uVar64 = b_03[uVar57][0];
                uVar58 = b_04[uVar57][0];
                uVar50 = b_05[uVar57][0];
                auVar133._0_8_ = uVar64 << 0x10;
                auVar133._8_8_ = b_03[uVar57][1] << 0x10 | uVar64 >> 0x30;
                auVar123._0_8_ = uVar58 << 0x10;
                auVar123._8_8_ = b_04[uVar57][1] << 0x10 | uVar58 >> 0x30;
                auVar66._0_8_ = uVar50 << 0x10;
                auVar66._8_8_ = b_05[uVar57][1] << 0x10 | uVar50 >> 0x30;
                auVar142._8_8_ = ptr[uVar57][1] << 0x10 | uVar43 >> 0x30;
                auVar142._0_8_ = uVar43 << 0x10 | (ulong)(ushort)ptr_06[uVar12];
                lVar18 = (long)ppVar4->mapper[(byte)s2[uVar12]] * uVar20 * 0x10;
                auVar89._4_2_ = local_138;
                auVar89._0_4_ = auVar51._0_4_;
                auVar89._6_2_ = uStack_136;
                auVar89._8_2_ = local_138;
                auVar89._10_2_ = uStack_136;
                auVar89._12_2_ = local_138;
                auVar89._14_2_ = uStack_136;
                auVar53 = psubsw(auVar89,(undefined1  [16])*ptr_04);
                local_1d8 = ZEXT816(0);
                lVar11 = 0;
                local_208 = ZEXT816(0);
                local_198 = ZEXT816(0);
                do {
                  auVar26 = *(undefined1 (*) [16])((long)*ptr + lVar11);
                  auVar27 = *(undefined1 (*) [16])((long)*b_03 + lVar11);
                  auVar60 = psubsw(auVar26,auVar118);
                  auVar28 = psubsw(*(undefined1 (*) [16])((long)*b + lVar11),auVar156);
                  sVar21 = auVar60._0_2_;
                  sVar99 = auVar28._0_2_;
                  auVar29._0_2_ = -(ushort)(sVar99 < sVar21);
                  sVar35 = auVar60._2_2_;
                  sVar101 = auVar28._2_2_;
                  auVar29._2_2_ = -(ushort)(sVar101 < sVar35);
                  sVar37 = auVar60._4_2_;
                  sVar103 = auVar28._4_2_;
                  auVar29._4_2_ = -(ushort)(sVar103 < sVar37);
                  sVar39 = auVar60._6_2_;
                  sVar105 = auVar28._6_2_;
                  auVar29._6_2_ = -(ushort)(sVar105 < sVar39);
                  sVar41 = auVar60._8_2_;
                  sVar107 = auVar28._8_2_;
                  auVar29._8_2_ = -(ushort)(sVar107 < sVar41);
                  sVar44 = auVar60._10_2_;
                  sVar109 = auVar28._10_2_;
                  auVar29._10_2_ = -(ushort)(sVar109 < sVar44);
                  sVar46 = auVar60._12_2_;
                  sVar111 = auVar28._12_2_;
                  sVar48 = auVar60._14_2_;
                  auVar29._12_2_ = -(ushort)(sVar111 < sVar46);
                  sVar113 = auVar28._14_2_;
                  auVar29._14_2_ = -(ushort)(sVar113 < sVar48);
                  auVar61 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar11),auVar27,auVar29);
                  auVar28 = *(undefined1 (*) [16])((long)*b_04 + lVar11);
                  auVar116 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar11),auVar28,auVar29);
                  auVar60 = *(undefined1 (*) [16])((long)*b_05 + lVar11);
                  auVar122 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar11),auVar60,auVar29);
                  auVar97 = paddsw(auVar53,*(undefined1 (*) [16])((long)*ptr_04 + lVar11));
                  sVar22 = auVar97._0_2_;
                  sVar88 = auVar89._0_2_;
                  auVar30._0_2_ = -(ushort)(sVar88 < sVar22);
                  sVar36 = auVar97._2_2_;
                  sVar90 = auVar89._2_2_;
                  auVar30._2_2_ = -(ushort)(sVar90 < sVar36);
                  sVar38 = auVar97._4_2_;
                  sVar91 = auVar89._4_2_;
                  auVar30._4_2_ = -(ushort)(sVar91 < sVar38);
                  sVar40 = auVar97._6_2_;
                  sVar92 = auVar89._6_2_;
                  auVar30._6_2_ = -(ushort)(sVar92 < sVar40);
                  sVar42 = auVar97._8_2_;
                  sVar93 = auVar89._8_2_;
                  auVar30._8_2_ = -(ushort)(sVar93 < sVar42);
                  sVar45 = auVar97._10_2_;
                  sVar94 = auVar89._10_2_;
                  auVar30._10_2_ = -(ushort)(sVar94 < sVar45);
                  sVar47 = auVar97._12_2_;
                  sVar95 = auVar89._12_2_;
                  sVar49 = auVar97._14_2_;
                  auVar30._12_2_ = -(ushort)(sVar95 < sVar47);
                  sVar96 = auVar89._14_2_;
                  auVar30._14_2_ = -(ushort)(sVar96 < sVar49);
                  local_198 = pblendvb(local_198,local_1c8,auVar30);
                  local_208 = pblendvb(local_208,local_1a8,auVar30);
                  uVar100 = (ushort)(sVar99 < sVar21) * sVar21 | (ushort)(sVar99 >= sVar21) * sVar99
                  ;
                  uVar102 = (ushort)(sVar101 < sVar35) * sVar35 |
                            (ushort)(sVar101 >= sVar35) * sVar101;
                  uVar104 = (ushort)(sVar103 < sVar37) * sVar37 |
                            (ushort)(sVar103 >= sVar37) * sVar103;
                  uVar106 = (ushort)(sVar105 < sVar39) * sVar39 |
                            (ushort)(sVar105 >= sVar39) * sVar105;
                  uVar108 = (ushort)(sVar107 < sVar41) * sVar41 |
                            (ushort)(sVar107 >= sVar41) * sVar107;
                  uVar110 = (ushort)(sVar109 < sVar44) * sVar44 |
                            (ushort)(sVar109 >= sVar44) * sVar109;
                  uVar112 = (ushort)(sVar111 < sVar46) * sVar46 |
                            (ushort)(sVar111 >= sVar46) * sVar111;
                  uVar114 = (ushort)(sVar113 < sVar48) * sVar48 |
                            (ushort)(sVar113 >= sVar48) * sVar113;
                  auVar89._0_2_ =
                       (ushort)(sVar22 < sVar88) * sVar88 | (ushort)(sVar22 >= sVar88) * sVar22;
                  auVar89._2_2_ =
                       (ushort)(sVar36 < sVar90) * sVar90 | (ushort)(sVar36 >= sVar90) * sVar36;
                  auVar89._4_2_ =
                       (ushort)(sVar38 < sVar91) * sVar91 | (ushort)(sVar38 >= sVar91) * sVar38;
                  auVar89._6_2_ =
                       (ushort)(sVar40 < sVar92) * sVar92 | (ushort)(sVar40 >= sVar92) * sVar40;
                  auVar89._8_2_ =
                       (ushort)(sVar42 < sVar93) * sVar93 | (ushort)(sVar42 >= sVar93) * sVar42;
                  auVar89._10_2_ =
                       (ushort)(sVar45 < sVar94) * sVar94 | (ushort)(sVar45 >= sVar94) * sVar45;
                  auVar89._12_2_ =
                       (ushort)(sVar47 < sVar95) * sVar95 | (ushort)(sVar47 >= sVar95) * sVar47;
                  auVar89._14_2_ =
                       (ushort)(sVar49 < sVar96) * sVar96 | (ushort)(sVar49 >= sVar96) * sVar49;
                  auVar97 = paddsw(auVar98,*(undefined1 (*) [16])((long)*ptr_05 + lVar11));
                  local_1d8 = pblendvb(local_1d8,auVar97,auVar30);
                  auVar143 = paddsw(auVar142,*(undefined1 (*) [16])((long)pvVar3 + lVar11 + lVar18))
                  ;
                  auVar134 = paddsw(auVar133,*(undefined1 (*) [16])((long)pvVar5 + lVar11 + lVar18))
                  ;
                  auVar129 = paddsw(auVar123,*(undefined1 (*) [16])((long)pvVar6 + lVar11 + lVar18))
                  ;
                  sVar21 = auVar143._0_2_;
                  auVar31._0_2_ = -(ushort)(sVar21 < (short)uVar100);
                  sVar22 = auVar143._2_2_;
                  auVar31._2_2_ = -(ushort)(sVar22 < (short)uVar102);
                  sVar35 = auVar143._4_2_;
                  auVar31._4_2_ = -(ushort)(sVar35 < (short)uVar104);
                  sVar36 = auVar143._6_2_;
                  auVar31._6_2_ = -(ushort)(sVar36 < (short)uVar106);
                  sVar37 = auVar143._8_2_;
                  auVar31._8_2_ = -(ushort)(sVar37 < (short)uVar108);
                  sVar38 = auVar143._10_2_;
                  auVar31._10_2_ = -(ushort)(sVar38 < (short)uVar110);
                  sVar39 = auVar143._12_2_;
                  auVar31._12_2_ = -(ushort)(sVar39 < (short)uVar112);
                  sVar40 = auVar143._14_2_;
                  auVar31._14_2_ = -(ushort)(sVar40 < (short)uVar114);
                  local_1c8 = pblendvb(auVar134,auVar61,auVar31);
                  local_1a8 = pblendvb(auVar129,auVar116,auVar31);
                  auVar97 = pmovsxbw(local_1d8,0x101010101010101);
                  auVar122 = paddsw(auVar122,auVar97);
                  auVar97 = paddsw(auVar66,auVar97);
                  auVar98 = pblendvb(auVar97,auVar122,auVar31);
                  puVar1 = (ushort *)((long)*b + lVar11);
                  *puVar1 = uVar100;
                  puVar1[1] = uVar102;
                  puVar1[2] = uVar104;
                  puVar1[3] = uVar106;
                  puVar1[4] = uVar108;
                  puVar1[5] = uVar110;
                  puVar1[6] = uVar112;
                  puVar1[7] = uVar114;
                  *(undefined1 (*) [16])((long)*b_00 + lVar11) = auVar61;
                  *(undefined1 (*) [16])((long)*b_01 + lVar11) = auVar116;
                  *(undefined1 (*) [16])((long)*b_02 + lVar11) = auVar122;
                  uVar100 = (ushort)((short)uVar100 < sVar21) * sVar21 |
                            ((short)uVar100 >= sVar21) * uVar100;
                  uVar102 = (ushort)((short)uVar102 < sVar22) * sVar22 |
                            ((short)uVar102 >= sVar22) * uVar102;
                  uVar104 = (ushort)((short)uVar104 < sVar35) * sVar35 |
                            ((short)uVar104 >= sVar35) * uVar104;
                  uVar106 = (ushort)((short)uVar106 < sVar36) * sVar36 |
                            ((short)uVar106 >= sVar36) * uVar106;
                  auVar53._0_8_ = CONCAT26(uVar106,CONCAT24(uVar104,CONCAT22(uVar102,uVar100)));
                  auVar53._8_2_ =
                       (ushort)((short)uVar108 < sVar37) * sVar37 |
                       ((short)uVar108 >= sVar37) * uVar108;
                  auVar53._10_2_ =
                       (ushort)((short)uVar110 < sVar38) * sVar38 |
                       ((short)uVar110 >= sVar38) * uVar110;
                  auVar53._12_2_ =
                       (ushort)((short)uVar112 < sVar39) * sVar39 |
                       ((short)uVar112 >= sVar39) * uVar112;
                  auVar53._14_2_ =
                       (ushort)((short)uVar114 < sVar40) * sVar40 |
                       ((short)uVar114 >= sVar40) * uVar114;
                  *(undefined1 (*) [16])((long)*ptr + lVar11) = auVar143;
                  *(undefined1 (*) [16])((long)*b_03 + lVar11) = auVar134;
                  *(undefined1 (*) [16])((long)*b_04 + lVar11) = auVar129;
                  *(undefined1 (*) [16])((long)*b_05 + lVar11) = auVar97;
                  lVar11 = lVar11 + 0x10;
                  auVar66 = auVar60;
                  auVar123 = auVar28;
                  auVar133 = auVar27;
                  auVar142 = auVar26;
                } while (uVar20 << 4 != lVar11);
                lVar11 = local_1c8._8_8_;
                uVar43 = local_1c8._0_8_;
                local_1c8._0_8_ = uVar43 << 0x10;
                local_1c8._8_8_ = lVar11 << 0x10 | uVar43 >> 0x30;
                lVar11 = local_1a8._8_8_;
                uVar43 = local_1a8._0_8_;
                local_1a8._0_8_ = uVar43 << 0x10;
                local_1a8._8_8_ = lVar11 << 0x10 | uVar43 >> 0x30;
                lVar11 = auVar98._8_8_;
                uVar43 = auVar98._0_8_;
                auVar98._0_8_ = uVar43 << 0x10;
                auVar98._8_8_ = lVar11 << 0x10 | uVar43 >> 0x30;
                auVar54._8_8_ = auVar53._8_8_ << 0x10 | (ulong)uVar106;
                uVar108 = ptr_06[uVar12 + 1];
                auVar54._0_8_ = auVar53._0_8_ << 0x10 | (ulong)uVar108;
                uVar12 = uVar12 + 1;
                auVar26 = paddsw((undefined1  [16])*ptr_04,auVar54);
                sVar21 = auVar26._0_2_;
                auVar32._0_2_ = -(ushort)(sVar21 < (short)auVar89._0_2_);
                sVar22 = auVar26._2_2_;
                auVar32._2_2_ = -(ushort)(sVar22 < (short)auVar89._2_2_);
                sVar35 = auVar26._4_2_;
                auVar32._4_2_ = -(ushort)(sVar35 < (short)auVar89._4_2_);
                sVar36 = auVar26._6_2_;
                auVar32._6_2_ = -(ushort)(sVar36 < (short)auVar89._6_2_);
                sVar37 = auVar26._8_2_;
                auVar32._8_2_ = -(ushort)(sVar37 < (short)auVar89._8_2_);
                sVar38 = auVar26._10_2_;
                auVar32._10_2_ = -(ushort)(sVar38 < (short)auVar89._10_2_);
                sVar39 = auVar26._12_2_;
                auVar32._12_2_ = -(ushort)(sVar39 < (short)auVar89._12_2_);
                sVar40 = auVar26._14_2_;
                auVar32._14_2_ = -(ushort)(sVar40 < (short)auVar89._14_2_);
                auVar67._0_2_ =
                     (sVar21 < (short)auVar89._0_2_) * auVar89._0_2_ |
                     (ushort)(sVar21 >= (short)auVar89._0_2_) * sVar21;
                auVar67._2_2_ =
                     (sVar22 < (short)auVar89._2_2_) * auVar89._2_2_ |
                     (ushort)(sVar22 >= (short)auVar89._2_2_) * sVar22;
                auVar67._4_2_ =
                     (sVar35 < (short)auVar89._4_2_) * auVar89._4_2_ |
                     (ushort)(sVar35 >= (short)auVar89._4_2_) * sVar35;
                auVar67._6_2_ =
                     (sVar36 < (short)auVar89._6_2_) * auVar89._6_2_ |
                     (ushort)(sVar36 >= (short)auVar89._6_2_) * sVar36;
                auVar67._8_2_ =
                     (sVar37 < (short)auVar89._8_2_) * auVar89._8_2_ |
                     (ushort)(sVar37 >= (short)auVar89._8_2_) * sVar37;
                auVar67._10_2_ =
                     (sVar38 < (short)auVar89._10_2_) * auVar89._10_2_ |
                     (ushort)(sVar38 >= (short)auVar89._10_2_) * sVar38;
                auVar67._12_2_ =
                     (sVar39 < (short)auVar89._12_2_) * auVar89._12_2_ |
                     (ushort)(sVar39 >= (short)auVar89._12_2_) * sVar39;
                auVar67._14_2_ =
                     (sVar40 < (short)auVar89._14_2_) * auVar89._14_2_ |
                     (ushort)(sVar40 >= (short)auVar89._14_2_) * sVar40;
                auVar26 = pblendvb(local_1c8,local_198,auVar32);
                auVar27 = pblendvb(local_1a8,local_208,auVar32);
                auVar28 = paddsw((undefined1  [16])*ptr_05,auVar98);
                auVar28 = pblendvb(auVar28,local_1d8,auVar32);
                iVar9 = 6;
                do {
                  auVar124._0_8_ = auVar26._0_8_ << 0x10;
                  auVar124._8_8_ = auVar26._8_8_ << 0x10 | auVar26._0_8_ >> 0x30;
                  auVar68._0_8_ = auVar67._0_8_ << 0x10;
                  auVar68._8_8_ = auVar67._8_8_ << 0x10 | auVar67._0_8_ >> 0x30;
                  auVar60 = paddsw(auVar68,auVar59);
                  sVar21 = auVar67._0_2_;
                  sVar41 = auVar60._0_2_;
                  auVar33._0_2_ = -(ushort)(sVar41 < sVar21);
                  sVar22 = auVar67._2_2_;
                  sVar42 = auVar60._2_2_;
                  auVar33._2_2_ = -(ushort)(sVar42 < sVar22);
                  sVar35 = auVar67._4_2_;
                  sVar44 = auVar60._4_2_;
                  auVar33._4_2_ = -(ushort)(sVar44 < sVar35);
                  sVar36 = auVar67._6_2_;
                  sVar45 = auVar60._6_2_;
                  auVar33._6_2_ = -(ushort)(sVar45 < sVar36);
                  sVar37 = auVar67._8_2_;
                  sVar46 = auVar60._8_2_;
                  auVar33._8_2_ = -(ushort)(sVar46 < sVar37);
                  sVar38 = auVar67._10_2_;
                  sVar47 = auVar60._10_2_;
                  auVar33._10_2_ = -(ushort)(sVar47 < sVar38);
                  sVar39 = auVar67._12_2_;
                  sVar48 = auVar60._12_2_;
                  sVar40 = auVar67._14_2_;
                  auVar33._12_2_ = -(ushort)(sVar48 < sVar39);
                  sVar49 = auVar60._14_2_;
                  auVar33._14_2_ = -(ushort)(sVar49 < sVar40);
                  auVar26 = pblendvb(auVar124,auVar26,auVar33);
                  auVar135._0_8_ = auVar27._0_8_ << 0x10;
                  auVar135._8_8_ = auVar27._8_8_ << 0x10 | auVar27._0_8_ >> 0x30;
                  auVar140._0_8_ = auVar28._0_8_ << 0x10;
                  auVar140._8_8_ = auVar28._8_8_ << 0x10 | auVar28._0_8_ >> 0x30;
                  auVar60 = paddsw(auVar140,auVar52);
                  uVar110 = (ushort)(sVar45 < sVar36) * sVar36 | (ushort)(sVar45 >= sVar36) * sVar45
                  ;
                  auVar67._0_8_ =
                       CONCAT26(uVar110,CONCAT24((ushort)(sVar44 < sVar35) * sVar35 |
                                                 (ushort)(sVar44 >= sVar35) * sVar44,
                                                 CONCAT22((ushort)(sVar42 < sVar22) * sVar22 |
                                                          (ushort)(sVar42 >= sVar22) * sVar42,
                                                          (ushort)(sVar41 < sVar21) * sVar21 |
                                                          (ushort)(sVar41 >= sVar21) * sVar41)));
                  auVar67._8_2_ =
                       (ushort)(sVar46 < sVar37) * sVar37 | (ushort)(sVar46 >= sVar37) * sVar46;
                  auVar67._10_2_ =
                       (ushort)(sVar47 < sVar38) * sVar38 | (ushort)(sVar47 >= sVar38) * sVar47;
                  auVar67._12_2_ =
                       (ushort)(sVar48 < sVar39) * sVar39 | (ushort)(sVar48 >= sVar39) * sVar48;
                  auVar67._14_2_ =
                       (ushort)(sVar49 < sVar40) * sVar40 | (ushort)(sVar49 >= sVar40) * sVar49;
                  auVar27 = pblendvb(auVar135,auVar27,auVar33);
                  auVar28 = pblendvb(auVar60,auVar28,auVar33);
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
                auVar69._0_8_ = auVar67._0_8_ << 0x10;
                auVar69._8_8_ = auVar67._8_8_ << 0x10 | (ulong)uVar110;
                auVar70 = paddsw(auVar69,ZEXT416(uVar8 & 0xffff));
                sVar21 = auVar70._0_2_;
                auVar34._0_2_ = -(ushort)((short)uVar108 < sVar21);
                sVar22 = auVar70._2_2_;
                auVar34._2_2_ = -(ushort)((short)uVar100 < sVar22);
                sVar35 = auVar70._4_2_;
                auVar34._4_2_ = -(ushort)((short)uVar102 < sVar35);
                sVar36 = auVar70._6_2_;
                auVar34._6_2_ = -(ushort)((short)uVar104 < sVar36);
                sVar37 = auVar70._8_2_;
                auVar34._8_2_ = -(ushort)((short)uVar106 < sVar37);
                sVar38 = auVar70._10_2_;
                auVar34._10_2_ = -(ushort)((short)auVar53._8_2_ < sVar38);
                sVar39 = auVar70._12_2_;
                sVar40 = auVar70._14_2_;
                auVar34._12_2_ = -(ushort)((short)auVar53._10_2_ < sVar39);
                auVar34._14_2_ = -(ushort)((short)auVar53._12_2_ < sVar40);
                auVar125._0_8_ = auVar26._0_8_ << 0x10;
                auVar125._8_8_ = auVar26._8_8_ << 0x10 | auVar26._0_8_ >> 0x30;
                auVar60 = pblendvb(local_1c8,auVar125,auVar34);
                auVar55._0_2_ =
                     (ushort)((short)uVar108 < sVar21) * sVar21 |
                     ((short)uVar108 >= sVar21) * uVar108;
                auVar55._2_2_ =
                     (ushort)((short)uVar100 < sVar22) * sVar22 |
                     ((short)uVar100 >= sVar22) * uVar100;
                auVar55._4_2_ =
                     (ushort)((short)uVar102 < sVar35) * sVar35 |
                     ((short)uVar102 >= sVar35) * uVar102;
                auVar55._6_2_ =
                     (ushort)((short)uVar104 < sVar36) * sVar36 |
                     ((short)uVar104 >= sVar36) * uVar104;
                auVar55._8_2_ =
                     (ushort)((short)uVar106 < sVar37) * sVar37 |
                     ((short)uVar106 >= sVar37) * uVar106;
                auVar55._10_2_ =
                     (ushort)((short)auVar53._8_2_ < sVar38) * sVar38 |
                     ((short)auVar53._8_2_ >= sVar38) * auVar53._8_2_;
                auVar55._12_2_ =
                     (ushort)((short)auVar53._10_2_ < sVar39) * sVar39 |
                     ((short)auVar53._10_2_ >= sVar39) * auVar53._10_2_;
                auVar55._14_2_ =
                     (ushort)((short)auVar53._12_2_ < sVar40) * sVar40 |
                     ((short)auVar53._12_2_ >= sVar40) * auVar53._12_2_;
                auVar136._0_8_ = auVar27._0_8_ << 0x10;
                auVar136._8_8_ = auVar27._8_8_ << 0x10 | auVar27._0_8_ >> 0x30;
                auVar26 = pblendvb(local_1a8,auVar136,auVar34);
                auVar141._0_8_ = auVar28._0_8_ << 0x10;
                auVar141._8_8_ = auVar28._8_8_ << 0x10 | auVar28._0_8_ >> 0x30;
                auVar27 = pblendvb(auVar98,auVar141,auVar34);
                lVar11 = 0;
                do {
                  auVar28 = psubsw(auVar55,auVar118);
                  auVar97 = psubsw(auVar70,auVar156);
                  sVar21 = auVar28._0_2_;
                  sVar41 = auVar97._0_2_;
                  auVar56._0_2_ = -(ushort)(sVar41 < sVar21);
                  sVar22 = auVar28._2_2_;
                  sVar42 = auVar97._2_2_;
                  auVar56._2_2_ = -(ushort)(sVar42 < sVar22);
                  sVar35 = auVar28._4_2_;
                  sVar44 = auVar97._4_2_;
                  auVar56._4_2_ = -(ushort)(sVar44 < sVar35);
                  sVar36 = auVar28._6_2_;
                  sVar45 = auVar97._6_2_;
                  auVar56._6_2_ = -(ushort)(sVar45 < sVar36);
                  sVar37 = auVar28._8_2_;
                  sVar46 = auVar97._8_2_;
                  auVar56._8_2_ = -(ushort)(sVar46 < sVar37);
                  sVar38 = auVar28._10_2_;
                  sVar47 = auVar97._10_2_;
                  auVar56._10_2_ = -(ushort)(sVar47 < sVar38);
                  sVar39 = auVar28._12_2_;
                  sVar48 = auVar97._12_2_;
                  sVar40 = auVar28._14_2_;
                  auVar56._12_2_ = -(ushort)(sVar48 < sVar39);
                  sVar49 = auVar97._14_2_;
                  auVar56._14_2_ = -(ushort)(sVar49 < sVar40);
                  auVar125 = pblendvb(auVar125,auVar60,auVar56);
                  auVar136 = pblendvb(auVar136,auVar26,auVar56);
                  puVar1 = (ushort *)((long)*ptr + lVar11);
                  uVar100 = *puVar1;
                  uVar102 = puVar1[1];
                  uVar104 = puVar1[2];
                  uVar106 = puVar1[3];
                  uVar108 = puVar1[4];
                  uVar110 = puVar1[5];
                  uVar112 = puVar1[6];
                  uVar114 = puVar1[7];
                  auVar26 = pblendvb(auVar141,auVar27,auVar56);
                  auVar70._0_2_ =
                       (ushort)(sVar21 < sVar41) * sVar41 | (ushort)(sVar21 >= sVar41) * sVar21;
                  auVar70._2_2_ =
                       (ushort)(sVar22 < sVar42) * sVar42 | (ushort)(sVar22 >= sVar42) * sVar22;
                  auVar70._4_2_ =
                       (ushort)(sVar35 < sVar44) * sVar44 | (ushort)(sVar35 >= sVar44) * sVar35;
                  auVar70._6_2_ =
                       (ushort)(sVar36 < sVar45) * sVar45 | (ushort)(sVar36 >= sVar45) * sVar36;
                  auVar70._8_2_ =
                       (ushort)(sVar37 < sVar46) * sVar46 | (ushort)(sVar37 >= sVar46) * sVar37;
                  auVar70._10_2_ =
                       (ushort)(sVar38 < sVar47) * sVar47 | (ushort)(sVar38 >= sVar47) * sVar38;
                  auVar70._12_2_ =
                       (ushort)(sVar39 < sVar48) * sVar48 | (ushort)(sVar39 >= sVar48) * sVar39;
                  auVar70._14_2_ =
                       (ushort)(sVar40 < sVar49) * sVar49 | (ushort)(sVar40 >= sVar49) * sVar40;
                  psVar2 = (short *)((long)*b + lVar11);
                  sVar21 = *psVar2;
                  sVar22 = psVar2[1];
                  sVar35 = psVar2[2];
                  sVar36 = psVar2[3];
                  sVar37 = psVar2[4];
                  sVar38 = psVar2[5];
                  sVar39 = psVar2[6];
                  sVar40 = psVar2[7];
                  uVar63 = (sVar21 < (short)uVar100) * uVar100 |
                           (ushort)(sVar21 >= (short)uVar100) * sVar21;
                  uVar72 = (sVar22 < (short)uVar102) * uVar102 |
                           (ushort)(sVar22 >= (short)uVar102) * sVar22;
                  uVar73 = (sVar35 < (short)uVar104) * uVar104 |
                           (ushort)(sVar35 >= (short)uVar104) * sVar35;
                  uVar74 = (sVar36 < (short)uVar106) * uVar106 |
                           (ushort)(sVar36 >= (short)uVar106) * sVar36;
                  uVar75 = (sVar37 < (short)uVar108) * uVar108 |
                           (ushort)(sVar37 >= (short)uVar108) * sVar37;
                  uVar76 = (sVar38 < (short)uVar110) * uVar110 |
                           (ushort)(sVar38 >= (short)uVar110) * sVar38;
                  uVar77 = (sVar39 < (short)uVar112) * uVar112 |
                           (ushort)(sVar39 >= (short)uVar112) * sVar39;
                  uVar78 = (sVar40 < (short)uVar114) * uVar114 |
                           (ushort)(sVar40 >= (short)uVar114) * sVar40;
                  auVar55._0_2_ =
                       ((short)uVar63 < (short)auVar70._0_2_) * auVar70._0_2_ |
                       ((short)uVar63 >= (short)auVar70._0_2_) * uVar63;
                  auVar55._2_2_ =
                       ((short)uVar72 < (short)auVar70._2_2_) * auVar70._2_2_ |
                       ((short)uVar72 >= (short)auVar70._2_2_) * uVar72;
                  auVar55._4_2_ =
                       ((short)uVar73 < (short)auVar70._4_2_) * auVar70._4_2_ |
                       ((short)uVar73 >= (short)auVar70._4_2_) * uVar73;
                  auVar55._6_2_ =
                       ((short)uVar74 < (short)auVar70._6_2_) * auVar70._6_2_ |
                       ((short)uVar74 >= (short)auVar70._6_2_) * uVar74;
                  auVar55._8_2_ =
                       ((short)uVar75 < (short)auVar70._8_2_) * auVar70._8_2_ |
                       ((short)uVar75 >= (short)auVar70._8_2_) * uVar75;
                  auVar55._10_2_ =
                       ((short)uVar76 < (short)auVar70._10_2_) * auVar70._10_2_ |
                       ((short)uVar76 >= (short)auVar70._10_2_) * uVar76;
                  auVar55._12_2_ =
                       ((short)uVar77 < (short)auVar70._12_2_) * auVar70._12_2_ |
                       ((short)uVar77 >= (short)auVar70._12_2_) * uVar77;
                  auVar55._14_2_ =
                       ((short)uVar78 < (short)auVar70._14_2_) * auVar70._14_2_ |
                       ((short)uVar78 >= (short)auVar70._14_2_) * uVar78;
                  auVar62._0_2_ = -(ushort)(uVar100 == auVar55._0_2_);
                  auVar62._2_2_ = -(ushort)(uVar102 == auVar55._2_2_);
                  auVar62._4_2_ = -(ushort)(uVar104 == auVar55._4_2_);
                  auVar62._6_2_ = -(ushort)(uVar106 == auVar55._6_2_);
                  auVar62._8_2_ = -(ushort)(uVar108 == auVar55._8_2_);
                  auVar62._10_2_ = -(ushort)(uVar110 == auVar55._10_2_);
                  auVar62._12_2_ = -(ushort)(uVar112 == auVar55._12_2_);
                  auVar62._14_2_ = -(ushort)(uVar114 == auVar55._14_2_);
                  auVar71._0_2_ = -(ushort)((short)auVar70._0_2_ < (short)uVar63);
                  auVar71._2_2_ = -(ushort)((short)auVar70._2_2_ < (short)uVar72);
                  auVar71._4_2_ = -(ushort)((short)auVar70._4_2_ < (short)uVar73);
                  auVar71._6_2_ = -(ushort)((short)auVar70._6_2_ < (short)uVar74);
                  auVar71._8_2_ = -(ushort)((short)auVar70._8_2_ < (short)uVar75);
                  auVar71._10_2_ = -(ushort)((short)auVar70._10_2_ < (short)uVar76);
                  auVar71._12_2_ = -(ushort)((short)auVar70._12_2_ < (short)uVar77);
                  auVar71._14_2_ = -(ushort)((short)auVar70._14_2_ < (short)uVar78);
                  auVar27 = pblendvb(auVar125,*(undefined1 (*) [16])((long)*b_00 + lVar11),auVar71);
                  auVar60 = pblendvb(auVar27,*(undefined1 (*) [16])((long)*b_03 + lVar11),auVar62);
                  auVar141 = paddsw(auVar26,_DAT_00904d10);
                  auVar26 = pblendvb(auVar136,*(undefined1 (*) [16])((long)*b_01 + lVar11),auVar71);
                  auVar26 = pblendvb(auVar26,*(undefined1 (*) [16])((long)*b_04 + lVar11),auVar62);
                  auVar27 = pblendvb(auVar141,*(undefined1 (*) [16])((long)*b_02 + lVar11),auVar71);
                  auVar27 = pblendvb(auVar27,*(undefined1 (*) [16])((long)*b_05 + lVar11),auVar62);
                  *(undefined1 (*) [16])((long)*ptr + lVar11) = auVar55;
                  *(undefined1 (*) [16])((long)*b_03 + lVar11) = auVar60;
                  *(undefined1 (*) [16])((long)*b_04 + lVar11) = auVar26;
                  *(undefined1 (*) [16])((long)*b_05 + lVar11) = auVar27;
                  uVar144 = ((short)auVar55._0_2_ < (short)uVar144) * auVar55._0_2_ |
                            ((short)auVar55._0_2_ >= (short)uVar144) * uVar144;
                  uVar146 = ((short)auVar55._2_2_ < (short)uVar146) * auVar55._2_2_ |
                            ((short)auVar55._2_2_ >= (short)uVar146) * uVar146;
                  uVar147 = ((short)auVar55._4_2_ < (short)uVar147) * auVar55._4_2_ |
                            ((short)auVar55._4_2_ >= (short)uVar147) * uVar147;
                  uVar148 = ((short)auVar55._6_2_ < (short)uVar148) * auVar55._6_2_ |
                            ((short)auVar55._6_2_ >= (short)uVar148) * uVar148;
                  uVar149 = ((short)auVar55._8_2_ < (short)uVar149) * auVar55._8_2_ |
                            ((short)auVar55._8_2_ >= (short)uVar149) * uVar149;
                  uVar150 = ((short)auVar55._10_2_ < (short)uVar150) * auVar55._10_2_ |
                            ((short)auVar55._10_2_ >= (short)uVar150) * uVar150;
                  uVar151 = ((short)auVar55._12_2_ < (short)uVar151) * auVar55._12_2_ |
                            ((short)auVar55._12_2_ >= (short)uVar151) * uVar151;
                  uVar153 = ((short)auVar55._14_2_ < (short)uVar153) * auVar55._14_2_ |
                            ((short)auVar55._14_2_ >= (short)uVar153) * uVar153;
                  uVar79 = ((short)uVar79 < (short)auVar55._0_2_) * auVar55._0_2_ |
                           ((short)uVar79 >= (short)auVar55._0_2_) * uVar79;
                  uVar81 = ((short)uVar81 < (short)auVar55._2_2_) * auVar55._2_2_ |
                           ((short)uVar81 >= (short)auVar55._2_2_) * uVar81;
                  uVar82 = ((short)uVar82 < (short)auVar55._4_2_) * auVar55._4_2_ |
                           ((short)uVar82 >= (short)auVar55._4_2_) * uVar82;
                  uVar83 = ((short)uVar83 < (short)auVar55._6_2_) * auVar55._6_2_ |
                           ((short)uVar83 >= (short)auVar55._6_2_) * uVar83;
                  uVar84 = ((short)uVar84 < (short)auVar55._8_2_) * auVar55._8_2_ |
                           ((short)uVar84 >= (short)auVar55._8_2_) * uVar84;
                  uVar85 = ((short)uVar85 < (short)auVar55._10_2_) * auVar55._10_2_ |
                           ((short)uVar85 >= (short)auVar55._10_2_) * uVar85;
                  uVar86 = ((short)uVar86 < (short)auVar55._12_2_) * auVar55._12_2_ |
                           ((short)uVar86 >= (short)auVar55._12_2_) * uVar86;
                  uVar87 = ((short)uVar87 < (short)auVar55._14_2_) * auVar55._14_2_ |
                           ((short)uVar87 >= (short)auVar55._14_2_) * uVar87;
                  sVar21 = auVar60._0_2_;
                  uVar79 = (ushort)((short)uVar79 < sVar21) * sVar21 |
                           ((short)uVar79 >= sVar21) * uVar79;
                  sVar21 = auVar60._2_2_;
                  uVar81 = (ushort)((short)uVar81 < sVar21) * sVar21 |
                           ((short)uVar81 >= sVar21) * uVar81;
                  sVar21 = auVar60._4_2_;
                  uVar82 = (ushort)((short)uVar82 < sVar21) * sVar21 |
                           ((short)uVar82 >= sVar21) * uVar82;
                  sVar21 = auVar60._6_2_;
                  uVar83 = (ushort)((short)uVar83 < sVar21) * sVar21 |
                           ((short)uVar83 >= sVar21) * uVar83;
                  sVar21 = auVar60._8_2_;
                  uVar84 = (ushort)((short)uVar84 < sVar21) * sVar21 |
                           ((short)uVar84 >= sVar21) * uVar84;
                  sVar21 = auVar60._10_2_;
                  uVar85 = (ushort)((short)uVar85 < sVar21) * sVar21 |
                           ((short)uVar85 >= sVar21) * uVar85;
                  sVar21 = auVar60._12_2_;
                  uVar86 = (ushort)((short)uVar86 < sVar21) * sVar21 |
                           ((short)uVar86 >= sVar21) * uVar86;
                  sVar21 = auVar60._14_2_;
                  uVar87 = (ushort)((short)uVar87 < sVar21) * sVar21 |
                           ((short)uVar87 >= sVar21) * uVar87;
                  sVar21 = auVar27._0_2_;
                  sVar22 = auVar26._0_2_;
                  uVar100 = (ushort)(sVar22 < sVar21) * sVar21 | (ushort)(sVar22 >= sVar21) * sVar22
                  ;
                  sVar21 = auVar27._2_2_;
                  sVar22 = auVar26._2_2_;
                  uVar102 = (ushort)(sVar22 < sVar21) * sVar21 | (ushort)(sVar22 >= sVar21) * sVar22
                  ;
                  sVar21 = auVar27._4_2_;
                  sVar22 = auVar26._4_2_;
                  uVar104 = (ushort)(sVar22 < sVar21) * sVar21 | (ushort)(sVar22 >= sVar21) * sVar22
                  ;
                  sVar21 = auVar27._6_2_;
                  sVar22 = auVar26._6_2_;
                  uVar106 = (ushort)(sVar22 < sVar21) * sVar21 | (ushort)(sVar22 >= sVar21) * sVar22
                  ;
                  sVar21 = auVar27._8_2_;
                  sVar22 = auVar26._8_2_;
                  uVar108 = (ushort)(sVar22 < sVar21) * sVar21 | (ushort)(sVar22 >= sVar21) * sVar22
                  ;
                  sVar21 = auVar27._10_2_;
                  sVar22 = auVar26._10_2_;
                  uVar110 = (ushort)(sVar22 < sVar21) * sVar21 | (ushort)(sVar22 >= sVar21) * sVar22
                  ;
                  sVar21 = auVar27._12_2_;
                  sVar22 = auVar26._12_2_;
                  sVar35 = auVar26._14_2_;
                  uVar112 = (ushort)(sVar22 < sVar21) * sVar21 | (ushort)(sVar22 >= sVar21) * sVar22
                  ;
                  sVar21 = auVar27._14_2_;
                  uVar114 = (ushort)(sVar35 < sVar21) * sVar21 | (ushort)(sVar35 >= sVar21) * sVar35
                  ;
                  uVar79 = ((short)uVar100 < (short)uVar79) * uVar79 |
                           ((short)uVar100 >= (short)uVar79) * uVar100;
                  uVar81 = ((short)uVar102 < (short)uVar81) * uVar81 |
                           ((short)uVar102 >= (short)uVar81) * uVar102;
                  uVar82 = ((short)uVar104 < (short)uVar82) * uVar82 |
                           ((short)uVar104 >= (short)uVar82) * uVar104;
                  uVar83 = ((short)uVar106 < (short)uVar83) * uVar83 |
                           ((short)uVar106 >= (short)uVar83) * uVar106;
                  uVar84 = ((short)uVar108 < (short)uVar84) * uVar84 |
                           ((short)uVar108 >= (short)uVar84) * uVar108;
                  uVar85 = ((short)uVar110 < (short)uVar85) * uVar85 |
                           ((short)uVar110 >= (short)uVar85) * uVar110;
                  uVar86 = ((short)uVar112 < (short)uVar86) * uVar86 |
                           ((short)uVar112 >= (short)uVar86) * uVar112;
                  uVar87 = ((short)uVar114 < (short)uVar87) * uVar87 |
                           ((short)uVar114 >= (short)uVar87) * uVar114;
                  lVar11 = lVar11 + 0x10;
                } while (uVar20 << 4 != lVar11);
              } while (uVar12 != (uint)s2Len);
              uVar20 = ptr[uVar25][1];
              uVar12 = b_03[uVar25][1];
              uVar57 = b_04[uVar25][1];
              uVar43 = b_05[uVar25][1];
              if (iVar17 < 7) {
                iVar9 = 0;
                uVar64 = ptr[uVar25][0];
                uVar58 = b_03[uVar25][0];
                uVar50 = b_04[uVar25][0];
                uVar25 = b_05[uVar25][0];
                do {
                  uVar20 = uVar20 << 0x10 | uVar64 >> 0x30;
                  uVar12 = uVar12 << 0x10 | uVar58 >> 0x30;
                  uVar57 = uVar57 << 0x10 | uVar50 >> 0x30;
                  uVar43 = uVar43 << 0x10 | uVar25 >> 0x30;
                  iVar9 = iVar9 + 1;
                  uVar64 = uVar64 << 0x10;
                  uVar58 = uVar58 << 0x10;
                  uVar50 = uVar50 << 0x10;
                  uVar25 = uVar25 << 0x10;
                } while (iVar9 < 7 - iVar17);
              }
              auVar59._0_2_ = -(ushort)((short)uVar144 < (short)local_138);
              auVar59._2_2_ = -(ushort)((short)uVar146 < (short)uStack_136);
              auVar59._4_2_ = -(ushort)((short)uVar147 < (short)local_138);
              auVar59._6_2_ = -(ushort)((short)uVar148 < (short)uStack_136);
              auVar59._8_2_ = -(ushort)((short)uVar149 < (short)local_138);
              auVar59._10_2_ = -(ushort)((short)uVar150 < (short)uStack_136);
              auVar59._12_2_ = -(ushort)((short)uVar151 < (short)local_138);
              auVar59._14_2_ = -(ushort)((short)uVar153 < (short)uStack_136);
              auVar52._0_2_ = -(ushort)((short)local_88 < (short)uVar79);
              auVar52._2_2_ = -(ushort)((short)uStack_86 < (short)uVar81);
              auVar52._4_2_ = -(ushort)((short)local_88 < (short)uVar82);
              auVar52._6_2_ = -(ushort)((short)uStack_86 < (short)uVar83);
              auVar52._8_2_ = -(ushort)((short)local_88 < (short)uVar84);
              auVar52._10_2_ = -(ushort)((short)uStack_86 < (short)uVar85);
              auVar52._12_2_ = -(ushort)((short)local_88 < (short)uVar86);
              auVar52._14_2_ = -(ushort)((short)uStack_86 < (short)uVar87);
              auVar52 = auVar52 | auVar59;
              if ((((((((((((((((auVar52 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar52 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar52 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar52 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar52 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar52 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar52 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar52 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar52 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar52 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar52 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar52 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar52 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar52 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar52 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar52[0xf]) {
                sVar21 = (short)(uVar20 >> 0x30);
                sVar22 = (short)(uVar12 >> 0x30);
                sVar35 = (short)(uVar57 >> 0x30);
                sVar36 = (short)(uVar43 >> 0x30);
              }
              else {
                *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                sVar21 = 0;
                sVar22 = 0;
                sVar35 = 0;
                sVar36 = 0;
                iVar7 = 0;
                uVar16 = 0;
              }
              ppVar10->score = (int)sVar21;
              ppVar10->end_query = uVar16;
              ppVar10->end_ref = iVar7;
              *(int *)(ppVar10->field_4).extra = (int)sVar22;
              ((ppVar10->field_4).stats)->similar = (int)sVar35;
              ((ppVar10->field_4).stats)->length = (int)sVar36;
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(b_05);
              parasail_free(b_04);
              parasail_free(b_03);
              parasail_free(ptr);
              parasail_free(b_02);
              parasail_free(b_01);
              parasail_free(b_00);
              parasail_free(b);
              return ppVar10;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 2);
            vHM = _mm_slli_si128(vHM, 2);
            vHS = _mm_slli_si128(vHS, 2);
            vHL = _mm_slli_si128(vHL, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
        matches = (int16_t) _mm_extract_epi16 (vHM, 7);
        similar = (int16_t) _mm_extract_epi16 (vHS, 7);
        length = (int16_t) _mm_extract_epi16 (vHL, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}